

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_mutex.h
# Opt level: O2

void __thiscall tthread::fast_mutex::lock(fast_mutex *this)

{
  int iVar1;
  int oldLock;
  
  while( true ) {
    LOCK();
    iVar1 = this->mLock;
    this->mLock = 1;
    UNLOCK();
    if (iVar1 == 0) break;
    sched_yield();
  }
  return;
}

Assistant:

inline void lock()
    {
#if defined(_FAST_MUTEX_ASM_)
      bool gotLock;
      do {
        gotLock = try_lock();
        if(!gotLock)
        {
  #if defined(_TTHREAD_WIN32_)
          Sleep(0);
  #elif defined(_TTHREAD_POSIX_)
          sched_yield();
  #endif
        }
      } while(!gotLock);
#else
  #if defined(_TTHREAD_WIN32_)
      EnterCriticalSection(&mHandle);
  #elif defined(_TTHREAD_POSIX_)
      pthread_mutex_lock(&mHandle);
  #endif
#endif
    }